

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryMode.cpp
# Opt level: O3

void __thiscall QueryMode::QueryMode(QueryMode *this,MySQLConnector *connector)

{
  QueryOutputWindow *this_00;
  QueryInputWindow *this_01;
  
  this->connector = connector;
  this_00 = (QueryOutputWindow *)operator_new(0x48);
  QueryOutputWindow::QueryOutputWindow(this_00);
  this->outputWindow = this_00;
  this_01 = (QueryInputWindow *)operator_new(0x48);
  QueryInputWindow::QueryInputWindow(this_01,connector,this_00);
  this->inputWindow = this_01;
  this->focusedWindow = (IWindow *)this_01;
  return;
}

Assistant:

QueryMode::QueryMode(MySQLConnector *connector)
{
	this->connector = connector;
	this->outputWindow = new QueryOutputWindow();
	this->inputWindow = new QueryInputWindow(connector, this->outputWindow);
	this->focusedWindow = this->inputWindow;
	//nodelay(this->inputWindow->getCursesWindow(), true);
	//nodelay(this->outputWindow->getCursesWindow(), true);
}